

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O2

void __thiscall wallet::WalletRescanReserver::~WalletRescanReserver(WalletRescanReserver *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_could_reserve == true) {
    LOCK();
    (this->m_wallet->fScanningWallet)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->m_wallet->m_scanning_with_passphrase)._M_base._M_i = false;
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::_Function_base::~_Function_base(&(this->m_now).super__Function_base);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~WalletRescanReserver()
    {
        if (m_could_reserve) {
            m_wallet.fScanningWallet = false;
            m_wallet.m_scanning_with_passphrase = false;
        }
    }